

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void __thiscall l2r_lr_fun::Hv(l2r_lr_fun *this,double *s,double *Hs)

{
  uint uVar1;
  feature_node *x;
  uint uVar2;
  feature_node *pfVar3;
  ulong uVar4;
  EVP_PKEY_CTX *ctx;
  ulong uVar5;
  double dVar6;
  
  uVar1 = this->prob->l;
  ctx = (EVP_PKEY_CTX *)s;
  uVar2 = (*(this->super_function)._vptr_function[3])();
  Reduce_Vectors::init(this->reduce_vectors,ctx);
  uVar4 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    dVar6 = 0.0;
    x = this->prob->x[uVar4];
    for (pfVar3 = x; (long)pfVar3->index != -1; pfVar3 = pfVar3 + 1) {
      dVar6 = dVar6 + s[(long)pfVar3->index + -1] * pfVar3->value;
    }
    Reduce_Vectors::sum_scale_x(this->reduce_vectors,this->C[uVar4] * this->D[uVar4] * dVar6,x);
  }
  Reduce_Vectors::reduce_sum(this->reduce_vectors,Hs);
  uVar4 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    Hs[uVar4] = s[uVar4] + Hs[uVar4];
  }
  return;
}

Assistant:

void l2r_lr_fun::Hv(double *s, double *Hs)
{
	int i;
	int l=prob->l;
	int w_size=get_nr_variable();
	double *wa = new double[l];

	reduce_vectors->init();

#ifdef ENABLED_OPENMP
#pragma omp parallel for private(i) schedule(guided)
#endif
	for(i=0;i<l;i++)
	{
		feature_node *xi=prob->x[i];
		wa[i] = 0;
		while(xi->index != -1)
		{
			wa[i] += s[xi->index-1]*xi->value;
			xi++;
		}
		wa[i] = C[i]*D[i]*wa[i];
	
		reduce_vectors->sum_scale_x(wa[i], prob->x[i]);
	}

	reduce_vectors->reduce_sum(Hs);
	for(i=0;i<w_size;i++)
		Hs[i] = s[i] + Hs[i];
	delete[] wa;
}